

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_set_cast(lyxp_set *set,lyxp_set_type target,lyd_node *cur_node,lys_module *param_4,
                 int options)

{
  longdouble lVar1;
  lyxp_set_type lVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  LY_ERR *pLVar6;
  undefined4 in_register_00000034;
  char *str_00;
  longdouble in_ST0;
  short sStack_70;
  short sStack_60;
  lyxp_set_nodes *local_50;
  char *str;
  longdouble num;
  int local_34;
  lys_module *plStack_30;
  int options_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  lyxp_set *plStack_18;
  lyxp_set_type target_local;
  lyxp_set *set_local;
  
  str_00 = (char *)CONCAT44(in_register_00000034,target);
  if ((set == (lyxp_set *)0x0) || (set->type == target)) {
    return 0;
  }
  local_34 = options;
  plStack_30 = param_4;
  local_mod_local = (lys_module *)cur_node;
  cur_node_local._4_4_ = target;
  plStack_18 = set;
  if ((target == LYXP_SET_NODE_SET) ||
     ((set->type == LYXP_SET_SNODE_SET && (target != LYXP_SET_EMPTY)))) {
    __assert_fail("(target != LYXP_SET_NODE_SET) && ((set->type != LYXP_SET_SNODE_SET) || (target == LYXP_SET_EMPTY))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x1d21,
                  "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                 );
  }
  if (set->type == LYXP_SET_SNODE_SET) {
    free((set->val).nodes);
    return -1;
  }
  if ((target == LYXP_SET_STRING) ||
     ((target == LYXP_SET_NUMBER &&
      ((set->type == LYXP_SET_NODE_SET || (set->type == LYXP_SET_EMPTY)))))) {
    switch(set->type) {
    case LYXP_SET_EMPTY:
      pcVar5 = strdup("");
      (plStack_18->val).str = pcVar5;
      if ((plStack_18->val).nodes == (lyxp_set_nodes *)0x0) {
        pLVar6 = ly_errno_location();
        *pLVar6 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_set_cast");
        return -1;
      }
      break;
    case LYXP_SET_NODE_SET:
      if (set->used == 0) {
        __assert_fail("set->used",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x1d4b,
                      "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                     );
      }
      iVar4 = set_sort(set,cur_node,options);
      if (1 < iVar4) {
        pLVar6 = ly_errno_location();
        *pLVar6 = LY_EINT;
        ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","lyxp_set_cast");
      }
      str_00 = (char *)local_mod_local;
      local_50 = (lyxp_set_nodes *)
                 cast_node_set_to_string(plStack_18,(lyd_node *)local_mod_local,plStack_30,local_34)
      ;
      if (local_50 == (lyxp_set_nodes *)0x0) {
        return -1;
      }
      free((plStack_18->val).nodes);
      (plStack_18->val).str = (char *)local_50;
      break;
    default:
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x1d63);
      return -1;
    case LYXP_SET_BOOLEAN:
      if ((set->val).bool == 0) {
        pcVar5 = strdup("false");
        (plStack_18->val).str = pcVar5;
      }
      else {
        pcVar5 = strdup("true");
        (plStack_18->val).str = pcVar5;
      }
      break;
    case LYXP_SET_NUMBER:
      if (NAN((set->val).num)) {
        pcVar5 = strdup("NaN");
        (plStack_18->val).str = pcVar5;
      }
      else {
        if (((set->val).num != (longdouble)0) || (NAN((set->val).num) || NAN((longdouble)0))) {
          if (((set->val).num != -(longdouble)0) || (NAN((set->val).num) || NAN(-(longdouble)0))) {
            sStack_60 = (short)((unkuint10)(set->val).num >> 0x40);
            uVar3 = 0;
            if ((longdouble)INFINITY <= ABS((set->val).num)) {
              uVar3 = (uint)((ulong)(long)sStack_60 >> 0xf) | 1;
            }
            if ((uVar3 == 0) || (*(short *)((long)&set->val + 8) < 0)) {
              sStack_70 = (short)((unkuint10)(set->val).num >> 0x40);
              uVar3 = 0;
              if ((longdouble)INFINITY <= ABS((set->val).num)) {
                uVar3 = (uint)((ulong)(long)sStack_70 >> 0xf) | 1;
              }
              if ((uVar3 == 0) || (-1 < *(short *)((long)&set->val + 8))) {
                lVar1 = (set->val).num;
                if (((longdouble)(long)ROUND(lVar1) != lVar1) ||
                   (NAN((longdouble)(long)ROUND(lVar1)) || NAN(lVar1))) {
                  str_00 = "%03.1Lf";
                  iVar4 = asprintf((char **)&local_50,"%03.1Lf");
                  if (iVar4 == -1) {
                    pLVar6 = ly_errno_location();
                    *pLVar6 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_set_cast");
                    return -1;
                  }
                  (plStack_18->val).nodes = local_50;
                }
                else {
                  str_00 = "%lld";
                  iVar4 = asprintf((char **)&local_50,"%lld",(long)ROUND((set->val).num));
                  if (iVar4 == -1) {
                    pLVar6 = ly_errno_location();
                    *pLVar6 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_set_cast");
                    return -1;
                  }
                  (plStack_18->val).nodes = local_50;
                }
              }
              else {
                pcVar5 = strdup("-Infinity");
                (plStack_18->val).str = pcVar5;
              }
            }
            else {
              pcVar5 = strdup("Infinity");
              (plStack_18->val).str = pcVar5;
            }
            break;
          }
        }
        pcVar5 = strdup("0");
        (plStack_18->val).str = pcVar5;
      }
    }
    plStack_18->type = LYXP_SET_STRING;
  }
  if (cur_node_local._4_4_ == LYXP_SET_NUMBER) {
    if (plStack_18->type == LYXP_SET_BOOLEAN) {
      if ((plStack_18->val).bool == 0) {
        (plStack_18->val).num = (longdouble)0;
      }
      else {
        (plStack_18->val).num = (longdouble)1;
      }
    }
    else {
      if (plStack_18->type != LYXP_SET_STRING) {
        pLVar6 = ly_errno_location();
        *pLVar6 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x1d79);
        return -1;
      }
      cast_string_to_number((longdouble *)(plStack_18->val).nodes,str_00);
      _str = in_ST0;
      free((plStack_18->val).nodes);
      (plStack_18->val).num = _str;
    }
    plStack_18->type = LYXP_SET_NUMBER;
  }
  if (cur_node_local._4_4_ != LYXP_SET_BOOLEAN) goto LAB_00197d8d;
  switch(plStack_18->type) {
  case LYXP_SET_EMPTY:
    (plStack_18->val).bool = 0;
    break;
  case LYXP_SET_NODE_SET:
    free((plStack_18->val).nodes);
    if (plStack_18->used == 0) {
      __assert_fail("set->used",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x1d95,
                    "int lyxp_set_cast(struct lyxp_set *, enum lyxp_set_type, const struct lyd_node *, const struct lys_module *, int)"
                   );
    }
    (plStack_18->val).bool = 1;
    break;
  default:
    pLVar6 = ly_errno_location();
    *pLVar6 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
           0x1d9c);
    return -1;
  case LYXP_SET_NUMBER:
    if (((plStack_18->val).num != (longdouble)0) ||
       (NAN((plStack_18->val).num) || NAN((longdouble)0))) {
      if ((((plStack_18->val).num != -(longdouble)0) ||
          (NAN((plStack_18->val).num) || NAN(-(longdouble)0))) && (!NAN((plStack_18->val).num))) {
        (plStack_18->val).bool = 1;
        break;
      }
    }
    (plStack_18->val).bool = 0;
    break;
  case LYXP_SET_STRING:
    if (*(plStack_18->val).str == '\0') {
      free((plStack_18->val).nodes);
      (plStack_18->val).bool = 0;
    }
    else {
      free((plStack_18->val).nodes);
      (plStack_18->val).bool = 1;
    }
  }
  plStack_18->type = LYXP_SET_BOOLEAN;
LAB_00197d8d:
  if (cur_node_local._4_4_ == LYXP_SET_EMPTY) {
    lVar2 = plStack_18->type;
    if (lVar2 == LYXP_SET_NODE_SET) {
      free((plStack_18->val).nodes);
    }
    else if (1 < lVar2 - LYXP_SET_BOOLEAN) {
      if (lVar2 != LYXP_SET_STRING) {
        pLVar6 = ly_errno_location();
        *pLVar6 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x1db0);
        return -1;
      }
      free((plStack_18->val).nodes);
    }
    plStack_18->type = LYXP_SET_EMPTY;
  }
  return 0;
}

Assistant:

int
lyxp_set_cast(struct lyxp_set *set, enum lyxp_set_type target, const struct lyd_node *cur_node,
              const struct lys_module *local_mod, int options)
{
    long double num;
    char *str;

    if (!set || (set->type == target)) {
        return EXIT_SUCCESS;
    }

    /* it's not possible to convert anything into a node set */
    assert((target != LYXP_SET_NODE_SET) && ((set->type != LYXP_SET_SNODE_SET) || (target == LYXP_SET_EMPTY)));

    if (set->type == LYXP_SET_SNODE_SET) {
        free(set->val.snodes);
        return -1;
    }

    /* to STRING */
    if ((target == LYXP_SET_STRING) || ((target == LYXP_SET_NUMBER)
            && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY)))) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
            if (isnan(set->val.num)) {
                set->val.str = strdup("NaN");
            } else if ((set->val.num == 0) || (set->val.num == -0.0f)) {
                set->val.str = strdup("0");
            } else if (isinf(set->val.num) && !signbit(set->val.num)) {
                set->val.str = strdup("Infinity");
            } else if (isinf(set->val.num) && signbit(set->val.num)) {
                set->val.str = strdup("-Infinity");
            } else if ((long long)set->val.num == set->val.num) {
                if (asprintf(&str, "%lld", (long long)set->val.num) == -1) {
                    LOGMEM;
                    return -1;
                }
                set->val.str = str;
            } else {
                if (asprintf(&str, "%03.1Lf", set->val.num) == -1) {
                    LOGMEM;
                    return -1;
                }
                set->val.str = str;
            }
            break;
        case LYXP_SET_BOOLEAN:
            if (set->val.bool) {
                set->val.str = strdup("true");
            } else {
                set->val.str = strdup("false");
            }
            break;
        case LYXP_SET_NODE_SET:
            assert(set->used);

#ifndef NDEBUG
            /* we need the set sorted, it affects the result */
            if (set_sort(set, cur_node, options) > 1) {
                LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
            }
#endif

            str = cast_node_set_to_string(set, (struct lyd_node *)cur_node, (struct lys_module *)local_mod, options);
            if (!str) {
                return -1;
            }
            free(set->val.nodes);
            set->val.str = str;
            break;
        case LYXP_SET_EMPTY:
            set->val.str = strdup("");
            if (!set->val.str) {
                LOGMEM;
                return -1;
            }
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_STRING;
    }

    /* to NUMBER */
    if (target == LYXP_SET_NUMBER) {
        switch (set->type) {
        case LYXP_SET_STRING:
            num = cast_string_to_number(set->val.str);
            free(set->val.str);
            set->val.num = num;
            break;
        case LYXP_SET_BOOLEAN:
            if (set->val.bool) {
                set->val.num = 1;
            } else {
                set->val.num = 0;
            }
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_NUMBER;
    }

    /* to BOOLEAN */
    if (target == LYXP_SET_BOOLEAN) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
            if ((set->val.num == 0) || (set->val.num == -0.0f) || isnan(set->val.num)) {
                set->val.bool = 0;
            } else {
                set->val.bool = 1;
            }
            break;
        case LYXP_SET_STRING:
            if (set->val.str[0]) {
                free(set->val.str);
                set->val.bool = 1;
            } else {
                free(set->val.str);
                set->val.bool = 0;
            }
            break;
        case LYXP_SET_NODE_SET:
            free(set->val.nodes);

            assert(set->used);
            set->val.bool = 1;
            break;
        case LYXP_SET_EMPTY:
            set->val.bool = 0;
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_BOOLEAN;
    }

    /* to EMPTY */
    if (target == LYXP_SET_EMPTY) {
        switch (set->type) {
        case LYXP_SET_NUMBER:
        case LYXP_SET_BOOLEAN:
            /* nothing to do */
            break;
        case LYXP_SET_STRING:
            free(set->val.str);
            break;
        case LYXP_SET_NODE_SET:
            free(set->val.nodes);
            break;
        default:
            LOGINT;
            return -1;
        }
        set->type = LYXP_SET_EMPTY;
    }

    return EXIT_SUCCESS;
}